

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int walWriteToLog(WalWriter *p,void *pContent,int iAmt,sqlite3_int64 iOffset)

{
  long lVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  int iFirstAmt;
  int iVar6;
  
  lVar1 = p->iSyncPoint;
  if ((lVar1 - iOffset != 0 && iOffset <= lVar1) && (lVar1 <= iAmt + iOffset)) {
    iVar6 = (int)(lVar1 - iOffset);
    iVar2 = (*p->pFd->pMethods->xWrite)(p->pFd,pContent,iVar6,iOffset);
    iVar3 = 0;
    if (iVar2 == 0) {
      iAmt = iAmt - iVar6;
      uVar5 = p->syncFlags & 3;
      if (uVar5 != 0) {
        iVar3 = (*p->pFd->pMethods->xSync)(p->pFd,uVar5);
      }
      iOffset = iOffset + iVar6;
      pContent = (void *)((long)pContent + (long)iVar6);
      bVar4 = iVar3 == 0 && iAmt != 0;
    }
    else {
      bVar4 = false;
      iVar3 = iVar2;
    }
    if (!bVar4) {
      return iVar3;
    }
  }
  iVar3 = (*p->pFd->pMethods->xWrite)(p->pFd,pContent,iAmt,iOffset);
  return iVar3;
}

Assistant:

static int walWriteToLog(
  WalWriter *p,              /* WAL to write to */
  void *pContent,            /* Content to be written */
  int iAmt,                  /* Number of bytes to write */
  sqlite3_int64 iOffset      /* Start writing at this offset */
){
  int rc;
  if( iOffset<p->iSyncPoint && iOffset+iAmt>=p->iSyncPoint ){
    int iFirstAmt = (int)(p->iSyncPoint - iOffset);
    rc = sqlite3OsWrite(p->pFd, pContent, iFirstAmt, iOffset);
    if( rc ) return rc;
    iOffset += iFirstAmt;
    iAmt -= iFirstAmt;
    pContent = (void*)(iFirstAmt + (char*)pContent);
    assert( WAL_SYNC_FLAGS(p->syncFlags)!=0 );
    rc = sqlite3OsSync(p->pFd, WAL_SYNC_FLAGS(p->syncFlags));
    if( iAmt==0 || rc ) return rc;
  }
  rc = sqlite3OsWrite(p->pFd, pContent, iAmt, iOffset);
  return rc;
}